

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTexture2LookupTestCase::writeDataToTexture
          (SparseTexture2LookupTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  undefined1 *this_00;
  GLuint GVar1;
  _Alloc_hider _Var2;
  int iVar3;
  GLenum GVar4;
  ostream *poVar5;
  size_t sVar6;
  TestError *this_01;
  int iVar7;
  size_type __new_size;
  long lVar8;
  SparseTexture2CommitmentTestCase *this_02;
  char *__end;
  GLint depth;
  GLint height;
  GLint width;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  ShaderProgram program;
  ProgramSources sources;
  TokenStrings s;
  int local_3c8;
  GLuint local_3c0;
  GLint local_3bc;
  SparseTexture2LookupTestCase *local_3b8;
  GLenum local_3ac;
  GLuint local_3a8;
  GLuint local_3a4;
  ostream *local_3a0;
  string local_398;
  string local_378;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_358;
  GLuint *local_338;
  string local_330;
  undefined1 local_310 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [6];
  pointer local_298;
  GLuint local_278;
  bool local_250;
  ProgramSources local_240;
  TokenStrings local_170;
  
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  local_338 = texture;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Fill Texture with shader [level: ",0x21);
  local_3a0 = (ostream *)this_00;
  poVar5 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] - ",4);
  local_3bc = level;
  if (level <= (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
               mState.levels + -1) {
    SparseTextureUtils::getTextureLevelSize
              (target,&(this->super_SparseTexture2CommitmentTestCase).
                       super_SparseTextureCommitmentTestCase.mState,level,(GLint *)&local_3a4,
               (GLint *)&local_3a8,(GLint *)&local_3c0);
    if ((0 < (int)local_3a8 && 0 < (int)local_3a4) &&
       ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
        minDepth <= (int)local_3c0)) {
      if (target == 0x8513) {
        local_3c0 = local_3c0 * 6;
      }
      GVar1 = local_3c0;
      iVar7 = local_3a8 * local_3a4;
      local_3b8 = this;
      iVar3 = tcu::TextureFormat::getPixelSize
                        (&(this->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mState.format);
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (size_type)(int)(iVar3 * GVar1 * iVar7);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_358,__new_size);
      memset(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,__new_size);
      if (0 < (this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
              mState.samples) {
        local_3ac = 0x822a;
        if (format != 0x81a5) {
          local_3ac = format;
        }
        local_3c8 = 0;
        do {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_398,st2_compute_textureFill,(allocator<char> *)&local_170);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
          this_02 = (SparseTexture2CommitmentTestCase *)0x1baafe4;
          local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"image","");
          SparseTexture2CommitmentTestCase::createShaderTokens
                    (&local_170,this_02,target,format,local_3c8,&local_378,&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != &local_330.field_2) {
            operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<INPUT_TYPE>",local_170.inputType._M_dataplus._M_p,&local_398);
          replaceToken("<POINT_TYPE>",local_170.pointType._M_dataplus._M_p,&local_398);
          replaceToken("<POINT_DEF>",local_170.pointDef._M_dataplus._M_p,&local_398);
          replaceToken("<RETURN_TYPE>",local_170.returnType._M_dataplus._M_p,&local_398);
          replaceToken("<RESULT_EXPECTED>",local_170.resultExpected._M_dataplus._M_p,&local_398);
          replaceToken("<SAMPLE_DEF>",local_170.sampleDef._M_dataplus._M_p,&local_398);
          memset(&local_240,0,0xac);
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          local_240.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_240._193_8_ = 0;
          local_310._0_4_ = 5;
          local_310._8_8_ = local_2f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_310 + 8),local_398._M_dataplus._M_p,
                     local_398._M_dataplus._M_p + local_398._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_240.sources + (uint)local_310._0_4_,(value_type *)(local_310 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._8_8_ != local_2f8) {
            operator_delete((void *)local_310._8_8_,local_2f8[0]._M_allocated_capacity + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    ((ShaderProgram *)local_310,
                     ((this->super_SparseTexture2CommitmentTestCase).
                      super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->m_renderCtx,
                     &local_240);
          if (local_250 == true) {
            (*gl->useProgram)(local_278);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xa79);
            (*gl->bindImageTexture)(0,*local_338,local_3bc,'\0',0,0x88b9,local_3ac);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xa7c);
            (*gl->uniform1i)(1,0);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xa7e);
            (*gl->dispatchCompute)(local_3a4,local_3a8,local_3c0);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xa80);
            (*gl->memoryBarrier)(0xffffffff);
            GVar4 = (*gl->getError)();
            glu::checkError(GVar4,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0xa82);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3a0,"Compute shader compilation failed (writing) for target: ",0x38);
            poVar5 = (ostream *)std::ostream::operator<<(local_3a0,target);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", format: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,format);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", sample: ",10);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3c8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", infoLog: ",0xb);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,((*local_298)->m_info).infoLog._M_dataplus._M_p,
                                ((*local_298)->m_info).infoLog._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", shaderSource: ",0x10);
            _Var2._M_p = local_398._M_dataplus._M_p;
            if (local_398._M_dataplus._M_p == (char *)0x0) {
              std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
            }
            else {
              sVar6 = strlen(local_398._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var2._M_p,sVar6);
            }
            this = local_3b8;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," - ",3);
          }
          glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_310);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_240.transformFeedbackVaryings);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&local_240.attribLocationBindings);
          lVar8 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&local_240.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar8));
            lVar8 = lVar8 + -0x18;
          } while (lVar8 != -0x18);
          SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&local_170);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          local_3c8 = local_3c8 + 1;
        } while (local_3c8 <
                 (this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.mState.samples);
      }
      if (local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_358.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_358.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_358.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    return true;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid level",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
             ,0xa4b);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SparseTexture2LookupTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format, GLuint& texture,
													  GLint level)
{
	mLog << "Fill Texture with shader [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			std::string shader = st2_compute_textureFill;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			GLint convFormat = format;
			if (format == GL_DEPTH_COMPONENT16)
				convFormat = GL_R16;

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
									GL_WRITE_ONLY, convFormat);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
			}
			else
			{
				mLog << "Compute shader compilation failed (writing) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";
			}
		}
	}

	return true;
}